

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNotationImpl.cpp
# Opt level: O2

void __thiscall xercesc_4_0::DOMNotationImpl::setBaseURI(DOMNotationImpl *this,XMLCh *baseURI)

{
  int iVar1;
  undefined4 extraout_var;
  XMLSize_t XVar2;
  XMLCh *target;
  long *plVar3;
  
  if ((baseURI == (XMLCh *)0x0) || (*baseURI == L'\0')) {
    target = (XMLCh *)0x0;
  }
  else {
    iVar1 = (*(this->super_DOMNotation).super_DOMNode._vptr_DOMNode[0xc])(this);
    plVar3 = (long *)(CONCAT44(extraout_var,iVar1) + -8);
    if (CONCAT44(extraout_var,iVar1) == 0) {
      plVar3 = (long *)0x0;
    }
    XVar2 = XMLString::stringLen(baseURI);
    target = (XMLCh *)(**(code **)(*plVar3 + 0x20))(plVar3,XVar2 * 2 + 0x12);
    XMLString::fixURI(baseURI,target);
  }
  this->fBaseURI = target;
  return;
}

Assistant:

void DOMNotationImpl::setBaseURI(const XMLCh* baseURI) {
    if (baseURI && *baseURI) {
        XMLCh* temp = (XMLCh*) ((DOMDocumentImpl *)getOwnerDocument())->allocate((XMLString::stringLen(baseURI) + 9)*sizeof(XMLCh));
        XMLString::fixURI(baseURI, temp);
        fBaseURI = temp;
    }
    else
        fBaseURI = 0;
}